

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O2

void __thiscall HttpData::newEvent(HttpData *this)

{
  EventLoop *this_00;
  __shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  ((this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->events_ =
       0xc0000001;
  this_00 = this->loop_;
  std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&(this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>);
  EventLoop::addToPoller(this_00,(shared_ptr<Channel> *)&local_28,2000);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

void HttpData::newEvent() {
  //cout << "new sock is coming to thread!" << " " << channel_->getFd() << endl;
  channel_->setEvents(DEFAULT_EVENT);
  loop_->addToPoller(channel_, DEFAULT_EXPIRED_TIME);
}